

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall StringViewTest_Length_Test::TestBody(StringViewTest_Length_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char str [100];
  char *in_stack_fffffffffffffec8;
  basic_string_view<char> *in_stack_fffffffffffffed0;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  char *in_stack_fffffffffffffee0;
  char *__s;
  int line;
  basic_string_view<char> *this_00;
  Type type;
  undefined7 in_stack_ffffffffffffff00;
  AssertionResult local_d8 [2];
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  basic_string_view<char> local_a8;
  size_t local_98;
  size_t local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  unsigned_long *val1;
  char *expr2;
  char *expr1;
  
  expr1 = (char *)0x0;
  val1 = (unsigned_long *)0x72747320656d6f73;
  expr2 = (char *)0x676e69;
  __s = &stack0xffffffffffffff88;
  local_90 = strlen(__s);
  this_00 = &local_a8;
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_98 = fmt::v5::basic_string_view<char>::size(this_00);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff78;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (__s,in_stack_fffffffffffffee0,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (unsigned_long *)in_stack_fffffffffffffed0);
  line = (int)((ulong)__s >> 0x20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  type = (Type)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    in_stack_fffffffffffffee0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1226f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,(char *)this_00,line,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x122746);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122795);
  strlen(&stack0xffffffffffffff88);
  pAVar3 = local_d8;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            (expr1,expr2,val1,(unsigned_long *)in_stack_ffffffffffffff80.ptr_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    testing::AssertionResult::failure_message((AssertionResult *)0x122837);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,(char *)this_00,line,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar3);
    testing::Message::~Message((Message *)0x122883);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1228cf);
  return;
}

Assistant:

TEST(StringViewTest, Length) {
  // Test that StringRef::size() returns string length, not buffer size.
  char str[100] = "some string";
  EXPECT_EQ(std::strlen(str), string_view(str).size());
  EXPECT_LT(std::strlen(str), sizeof(str));
}